

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O1

ValueProxy * __thiscall
LLVMBC::LLVMContext::
construct<LLVMBC::ValueProxy,LLVMBC::Type*&,LLVMBC::ModuleParseContext&,unsigned_long&>
          (LLVMContext *this,Type **u,ModuleParseContext *u_1,unsigned_long *u_2)

{
  uint64_t uVar1;
  ValueProxy *this_00;
  
  this_00 = (ValueProxy *)allocate(this,0x30,8);
  if (this_00 != (ValueProxy *)0x0) {
    uVar1 = *u_2;
    Value::Value((Value *)this_00,*u,Proxy);
    this_00->id = uVar1;
    this_00->context = u_1;
    this_00->proxy = (Value *)0x0;
    return this_00;
  }
  std::terminate();
}

Assistant:

T *construct(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);

		if (!std::is_trivially_destructible<T>::value)
			append_typed_destructor(t);
		return t;
	}